

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
qclab::dense::init_unique_array<std::complex<double>>(int64_t size,complex<double> value)

{
  pointer __first;
  pointer pcVar1;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_30;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> mem;
  int64_t size_local;
  complex<double> value_local;
  
  mem._M_t.super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
  ._M_t.super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = value._M_value._0_8_;
  value_local._M_value._8_8_ = size;
  alloc_unique_array<std::complex<double>>
            ((dense *)&local_30,
             (int64_t)mem._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  __first = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
            get(&local_30);
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           get(&local_30);
  std::fill<std::complex<double>*,std::complex<double>>
            (__first,pcVar1 + (long)mem._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl,(complex<double> *)&size_local);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             size,&local_30);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_30);
  return (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
            )size;
}

Assistant:

inline auto init_unique_array( const int64_t size , const T value ) {
      auto mem = alloc_unique_array< T >( size ) ;
      std::fill( mem.get() , mem.get() + size , value ) ;
      return mem ;
    }